

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::resize_var(Expr *expr,uint32_t target_width,Var *var,bool left)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  VarType VVar1;
  uint32_t *puVar2;
  element_type *this_00;
  element_type *peVar3;
  undefined1 local_48 [8];
  shared_ptr<kratos::VarCasted> var_casted;
  shared_ptr<kratos::Var> new_var;
  bool left_local;
  Var *var_local;
  uint32_t target_width_local;
  Expr *expr_local;
  
  VVar1 = Var::type(var);
  if (VVar1 == ConstValue) {
    puVar2 = Var::var_width(var);
    *puVar2 = target_width;
  }
  else {
    this = &var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    Var::cast((Var *)this,(VarCastType)var);
    std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    Var::as<kratos::VarCasted>((Var *)local_48);
    this_00 = std::__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
    VarCasted::set_target_width(this_00,target_width);
    if (left) {
      peVar3 = std::__shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2> *)local_48);
      expr->left = &peVar3->super_Var;
    }
    else {
      peVar3 = std::__shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2> *)local_48);
      expr->right = &peVar3->super_Var;
    }
    std::shared_ptr<kratos::VarCasted>::~shared_ptr((shared_ptr<kratos::VarCasted> *)local_48);
    std::shared_ptr<kratos::Var>::~shared_ptr
              ((shared_ptr<kratos::Var> *)
               &var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void resize_var(Expr *expr, uint32_t target_width, Var *var, bool left) {
    if (var->type() == VarType::ConstValue) {
        var->var_width() = target_width;
    } else {
        auto new_var = var->cast(VarCastType::Resize);
        auto var_casted = new_var->as<VarCasted>();
        var_casted->set_target_width(target_width);
        if (left) {
            expr->left = var_casted.get();
        } else {
            expr->right = var_casted.get();
        }
    }
}